

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O3

void epoll_fd_state_del(fd_state **fds_p,knote *kn,int ev)

{
  kqueue *pkVar1;
  fd_state *elm;
  
  pkVar1 = kn->kn_kq;
  elm = kn->kn_fds;
  if ((ev & 1U) != 0) {
    elm->fds_read = (knote *)0x0;
  }
  if ((ev & 4U) != 0) {
    elm->fds_write = (knote *)0x0;
  }
  if ((elm->fds_read == (knote *)0x0) && (elm->fds_write == (knote *)0x0)) {
    fd_st_RB_REMOVE(&pkVar1->kq_fd_st,elm);
    free(elm);
    *fds_p = (fd_state *)0x0;
  }
  kn->kn_fds = (fd_state *)0x0;
  return;
}

Assistant:

void epoll_fd_state_del(struct fd_state **fds_p, struct knote *kn, int ev)
{
    struct fd_state     *fds = kn->kn_fds;
    struct kqueue       *kq = kn->kn_kq;

    assert(ev & (EPOLLIN | EPOLLOUT));
    assert(fds); /* There ~must~ be an entry else something has gone horribly wrong */
    assert(!*fds_p || (*fds_p == kn->kn_fds));

    /*
     * copyin/copyout lock means we don't need
     * to protect operations here.
     */
    if (ev & EPOLLIN) {
        assert(fds->fds_read);
        fds->fds_read = NULL;
    }

    if (ev & EPOLLOUT) {
        assert(fds->fds_write);
        fds->fds_write = NULL;
    }

    if (!fds->fds_read && !fds->fds_write) {
        dbg_printf("fd_state: rm fd=%i", fds->fds_fd);
        RB_REMOVE(fd_st, &kq->kq_fd_st, fds);
        free(fds);
        *fds_p = NULL;
    } else {
        dbg_printf("fd_state: mod fd=%i events=0x%08x (%s)", fds->fds_fd, ev, epoll_flags_dump(ev));
    }
    kn->kn_fds = NULL;
}